

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

Vec3 __thiscall
anon_unknown.dwarf_45a12::MapDriver::predictFuturePosition(MapDriver *this,float predictionTime)

{
  Vec3 *in_RDI;
  Vec3 VVar1;
  Color futurePositionColor;
  Vec3 newSpoke;
  Vec3 spoke;
  float arcAngle;
  float arcLength;
  float rawLength;
  float circumference;
  float twoPi;
  float arcRadius;
  float sign;
  Vec3 center;
  Vec3 localCenterOfCurvature;
  float signedRadius;
  Vec3 prediction;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 uVar2;
  MapDriver *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe1c;
  float s;
  float in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined8 local_1c8;
  float local_1c0;
  Color *in_stack_fffffffffffffed0;
  float segments;
  float arcLength_00;
  float fVar3;
  undefined4 in_stack_fffffffffffffee4;
  Vec3 *start;
  float fVar4;
  undefined4 in_stack_fffffffffffffef4;
  undefined8 local_10;
  float local_8;
  
  if (((uint)in_RDI[0x1f].x & 1) == 0) {
    (**(code **)(*(long *)in_RDI + 0x40))();
    (**(code **)(*(long *)in_RDI + 0xd0))();
    OpenSteer::Vec3::operator*(in_RDI,in_stack_fffffffffffffe1c);
    VVar1 = OpenSteer::Vec3::operator+
                      (in_RDI,(Vec3 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
    ;
    local_1c8 = VVar1._0_8_;
    local_10 = local_1c8;
    local_1c0 = VVar1.z;
    local_8 = local_1c0;
  }
  else {
    nonZeroCurvatureQQQ(in_stack_fffffffffffffe10);
    s = 1.0;
    (**(code **)(*(long *)in_RDI + 0x10))();
    OpenSteer::Vec3::operator*(in_RDI,s);
    (**(code **)(*(long *)in_RDI + 0x40))();
    OpenSteer::Vec3::operator+(in_RDI,(Vec3 *)CONCAT44(s,in_stack_fffffffffffffe18));
    uVar2 = 0x40c90fdb;
    (**(code **)(*(long *)in_RDI + 0xd8))();
    arcLengthLimit((MapDriver *)CONCAT44(uVar2,in_stack_fffffffffffffe08),0.0,1.790459e-39);
    (**(code **)(*(long *)in_RDI + 0x40))();
    OpenSteer::Vec3::operator-(in_RDI,(Vec3 *)CONCAT44(s,in_stack_fffffffffffffe18));
    VVar1 = OpenSteer::Vec3::rotateAboutGlobalY
                      ((Vec3 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       in_stack_fffffffffffffe2c);
    start = VVar1._0_8_;
    fVar4 = VVar1.z;
    VVar1 = OpenSteer::Vec3::operator+(in_RDI,(Vec3 *)CONCAT44(s,in_stack_fffffffffffffe18));
    segments = VVar1.x;
    arcLength_00 = VVar1.y;
    local_8 = VVar1.z;
    local_10 = VVar1._0_8_;
    fVar3 = local_8;
    OpenSteer::Color::Color((Color *)&stack0xfffffffffffffec8,0.5,0.5,0.6,s);
    (**(code **)(*(long *)in_RDI + 0x40))();
    annotationXZArc((MapDriver *)CONCAT44(in_stack_fffffffffffffef4,fVar4),start,
                    (Vec3 *)CONCAT44(in_stack_fffffffffffffee4,fVar3),arcLength_00,(int)segments,
                    in_stack_fffffffffffffed0);
  }
  VVar1.z = local_8;
  VVar1.x = (float)(undefined4)local_10;
  VVar1.y = (float)local_10._4_4_;
  return VVar1;
}

Assistant:

Vec3 predictFuturePosition (const float predictionTime) const
        {
            if (curvedSteering)
            {
                // QQQ this chunk of code is repeated in far too many places,
                // QQQ it has to be moved inside some utility
                // QQQ 
                // QQQ and now, worse, I rearranged it to try the "limit arc
                // QQQ angle" trick
                const float signedRadius = 1 / nonZeroCurvatureQQQ ();
                const Vec3 localCenterOfCurvature = side () * signedRadius;
                const Vec3 center = position () + localCenterOfCurvature;
                const float sign = signedRadius < 0 ? 1.0f : -1.0f;
                const float arcRadius = signedRadius * -sign;
                const float twoPi = 2 * OPENSTEER_M_PI;
                const float circumference = twoPi * arcRadius;
                const float rawLength = speed() * predictionTime * sign;
                const float arcLength = arcLengthLimit (rawLength,
                                                        circumference * 0.25f);
                const float arcAngle = twoPi * arcLength / circumference;

                const Vec3 spoke = position () - center;
                const Vec3 newSpoke = spoke.rotateAboutGlobalY (arcAngle);
                const Vec3 prediction = newSpoke + center;

                // QQQ unify with annotatePathFollowing
                const Color futurePositionColor (0.5f, 0.5f, 0.6f);
                annotationXZArc (position (), center, arcLength, 20, 
                                 futurePositionColor);
                return prediction;
            }
            else
            {
                return position() + (velocity() * predictionTime);
            }
        }